

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O2

double reduce(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *mtrx,double ss)

{
  pointer pvVar1;
  ulong uVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  pointer pdVar4;
  double *pdVar5;
  pointer pvVar6;
  int i_1;
  int j_2;
  long lVar7;
  long lVar8;
  const_iterator cVar9;
  pointer pvVar10;
  int j_1;
  int i;
  ulong uVar11;
  int i_2;
  int j;
  double dVar12;
  vector<double,_std::allocator<double>_> vec_help;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec_help1;
  vector<double,_std::allocator<double>_> vec1;
  double local_50;
  vector<double,_std::allocator<double>_> vec_sum;
  
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar11 = 0;
  while( true ) {
    pvVar6 = (mtrx->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(mtrx->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18;
    if (uVar2 <= uVar11) break;
    lVar7 = 0;
    for (uVar2 = 0;
        lVar8 = *(long *)&pvVar6[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl
        , uVar2 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar6[uVar11].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + 8) - lVar8 >> 3);
        uVar2 = uVar2 + 1) {
      std::vector<double,_std::allocator<double>_>::push_back
                (&vec_help1,(value_type *)(lVar8 + lVar7));
      pvVar6 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 8;
    }
    lVar7 = (long)vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pdVar4 = vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
      if (NAN(*pdVar4)) goto LAB_00102050;
      if (NAN(pdVar4[1])) {
        pdVar4 = pdVar4 + 1;
        goto LAB_00102050;
      }
      if (NAN(pdVar4[2])) {
        pdVar4 = pdVar4 + 2;
        goto LAB_00102050;
      }
      if (NAN(pdVar4[3])) {
        pdVar4 = pdVar4 + 3;
        goto LAB_00102050;
      }
      pdVar4 = pdVar4 + 4;
      lVar7 = lVar7 + -0x20;
    }
    lVar7 = lVar7 >> 3;
    cVar9._M_current =
         vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (lVar7 == 1) {
LAB_00102031:
      if (NAN(*pdVar4)) goto LAB_00102050;
    }
    else {
      if (lVar7 == 2) {
LAB_00102023:
        if (!NAN(*pdVar4)) {
          pdVar4 = pdVar4 + 1;
          goto LAB_00102031;
        }
      }
      else {
        if (lVar7 != 3) goto LAB_00102080;
        if (!NAN(*pdVar4)) {
          pdVar4 = pdVar4 + 1;
          goto LAB_00102023;
        }
      }
LAB_00102050:
      cVar9._M_current = pdVar4;
      if (pdVar4 != vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        while (pdVar4 = pdVar4 + 1,
              pdVar4 != vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
          if (!NAN(*pdVar4)) {
            *cVar9._M_current = *pdVar4;
            cVar9._M_current = cVar9._M_current + 1;
          }
        }
      }
    }
LAB_00102080:
    std::vector<double,_std::allocator<double>_>::erase
              (&vec_help1,cVar9,
               (const_iterator)
               vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    _Var3 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    std::vector<double,_std::allocator<double>_>::push_back(&vec1,_Var3._M_current);
    if (vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    uVar11 = uVar11 + 1;
  }
  for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
    lVar7 = *(long *)&pvVar6[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl;
    pdVar4 = *(pointer *)
              ((long)&pvVar6[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (lVar8 = 0; (long)pdVar4 - lVar7 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      *(double *)(lVar7 + lVar8 * 8) =
           *(double *)(lVar7 + lVar8 * 8) -
           vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar11];
    }
  }
  for (uVar11 = 0;
      uVar2 = (long)*(pointer *)
                     ((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + 8) -
              *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data >> 3, uVar11 < uVar2; uVar11 = uVar11 + 1) {
    lVar7 = 0;
    for (uVar2 = 0;
        uVar2 < (ulong)(((long)(mtrx->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18);
        uVar2 = uVar2 + 1) {
      lVar8 = *(long *)((long)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + lVar7);
      dVar12 = *(double *)(lVar8 + uVar11 * 8);
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        std::vector<double,_std::allocator<double>_>::push_back
                  (&vec_help,(value_type *)(lVar8 + uVar11 * 8));
      }
      else {
        local_50 = 0.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vec_help,&local_50);
      }
      pvVar6 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x18;
    }
    lVar7 = (long)vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pdVar4 = vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
      if (NAN(*pdVar4)) goto LAB_00102224;
      if (NAN(pdVar4[1])) {
        pdVar4 = pdVar4 + 1;
        goto LAB_00102224;
      }
      if (NAN(pdVar4[2])) {
        pdVar4 = pdVar4 + 2;
        goto LAB_00102224;
      }
      if (NAN(pdVar4[3])) {
        pdVar4 = pdVar4 + 3;
        goto LAB_00102224;
      }
      pdVar4 = pdVar4 + 4;
      lVar7 = lVar7 + -0x20;
    }
    lVar7 = lVar7 >> 3;
    cVar9._M_current =
         vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (lVar7 == 1) {
LAB_00102205:
      if (NAN(*pdVar4)) goto LAB_00102224;
    }
    else {
      if (lVar7 == 2) {
LAB_001021f7:
        if (!NAN(*pdVar4)) {
          pdVar4 = pdVar4 + 1;
          goto LAB_00102205;
        }
      }
      else {
        if (lVar7 != 3) goto LAB_00102254;
        if (!NAN(*pdVar4)) {
          pdVar4 = pdVar4 + 1;
          goto LAB_001021f7;
        }
      }
LAB_00102224:
      cVar9._M_current = pdVar4;
      if (pdVar4 != vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        while (pdVar4 = pdVar4 + 1,
              pdVar4 != vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
          if (!NAN(*pdVar4)) {
            *cVar9._M_current = *pdVar4;
            cVar9._M_current = cVar9._M_current + 1;
          }
        }
      }
    }
LAB_00102254:
    std::vector<double,_std::allocator<double>_>::erase
              (&vec_help,cVar9,
               (const_iterator)
               vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    _Var3 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    std::vector<double,_std::allocator<double>_>::push_back(&vec2,_Var3._M_current);
    if (vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    pvVar6 = (mtrx->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  pvVar1 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (uVar11 = 0; pvVar10 = pvVar6, lVar7 = ((long)pvVar1 - (long)pvVar6) / 0x18, uVar11 != uVar2;
      uVar11 = uVar11 + 1) {
    while (lVar7 != 0) {
      lVar8 = *(long *)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar8 + uVar11 * 8) =
           *(double *)(lVar8 + uVar11 * 8) -
           vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar11];
      pvVar10 = pvVar10 + 1;
      lVar7 = lVar7 + -1;
    }
  }
  lVar7 = (long)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  pdVar4 = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (NAN(*pdVar4)) goto LAB_00102384;
    if (NAN(pdVar4[1])) {
      pdVar4 = pdVar4 + 1;
      goto LAB_00102384;
    }
    if (NAN(pdVar4[2])) {
      pdVar4 = pdVar4 + 2;
      goto LAB_00102384;
    }
    if (NAN(pdVar4[3])) {
      pdVar4 = pdVar4 + 3;
      goto LAB_00102384;
    }
    pdVar4 = pdVar4 + 4;
    lVar7 = lVar7 + -0x20;
  }
  lVar7 = lVar7 >> 3;
  cVar9._M_current =
       vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (lVar7 == 1) {
LAB_00102365:
    if (NAN(*pdVar4)) goto LAB_00102384;
  }
  else {
    if (lVar7 == 2) {
LAB_00102357:
      if (!NAN(*pdVar4)) {
        pdVar4 = pdVar4 + 1;
        goto LAB_00102365;
      }
    }
    else {
      if (lVar7 != 3) goto LAB_001023b4;
      if (!NAN(*pdVar4)) {
        pdVar4 = pdVar4 + 1;
        goto LAB_00102357;
      }
    }
LAB_00102384:
    cVar9._M_current = pdVar4;
    if (pdVar4 != vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      while (pdVar4 = pdVar4 + 1,
            pdVar4 != vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
        if (!NAN(*pdVar4)) {
          *cVar9._M_current = *pdVar4;
          cVar9._M_current = cVar9._M_current + 1;
        }
      }
    }
  }
LAB_001023b4:
  std::vector<double,_std::allocator<double>_>::erase
            (&vec1,cVar9,
             (const_iterator)
             vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  lVar7 = (long)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  pdVar4 = vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (NAN(*pdVar4)) goto LAB_0010246a;
    if (NAN(pdVar4[1])) {
      pdVar4 = pdVar4 + 1;
      goto LAB_0010246a;
    }
    if (NAN(pdVar4[2])) {
      pdVar4 = pdVar4 + 2;
      goto LAB_0010246a;
    }
    if (NAN(pdVar4[3])) {
      pdVar4 = pdVar4 + 3;
      goto LAB_0010246a;
    }
    pdVar4 = pdVar4 + 4;
    lVar7 = lVar7 + -0x20;
  }
  lVar7 = lVar7 >> 3;
  cVar9._M_current =
       vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (lVar7 == 1) {
LAB_0010244b:
    if (!NAN(*pdVar4)) goto LAB_0010249a;
  }
  else if (lVar7 == 2) {
LAB_0010243d:
    if (!NAN(*pdVar4)) {
      pdVar4 = pdVar4 + 1;
      goto LAB_0010244b;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_0010249a;
    if (!NAN(*pdVar4)) {
      pdVar4 = pdVar4 + 1;
      goto LAB_0010243d;
    }
  }
LAB_0010246a:
  cVar9._M_current = pdVar4;
  if (pdVar4 != vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    while (pdVar4 = pdVar4 + 1,
          pdVar4 != vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
      if (!NAN(*pdVar4)) {
        *cVar9._M_current = *pdVar4;
        cVar9._M_current = cVar9._M_current + 1;
      }
    }
  }
LAB_0010249a:
  std::vector<double,_std::allocator<double>_>::erase
            (&vec2,cVar9,
             (const_iterator)
             vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  dVar12 = 0.0;
  for (pdVar4 = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 = vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      pdVar4 != vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    dVar12 = dVar12 + *pdVar4;
  }
  for (; pdVar5 != vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    dVar12 = dVar12 + *pdVar5;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec_help1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec_sum.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec_help.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec1.super__Vector_base<double,_std::allocator<double>_>);
  return dVar12 + ss;
}

Assistant:

double reduce(std::vector<std::vector<double>>& mtrx, double ss){

    std::vector<double> vec1,vec2,vec_help,vec_sum,vec_help1;
    double lower_bound = 0;

    for(int i=0; i<mtrx.size();i++){
        for (int j=0; j<mtrx[i].size(); j++){
            vec_help1.push_back(mtrx[i][j]);
        }
        vec_help1.erase(std::remove_if(std::begin(vec_help1),std::end(vec_help1), [](const auto& value) {return std::isnan(value);}),std::end(vec_help1));
        vec1.push_back(*std::min_element(vec_help1.begin(),vec_help1.end()));
        vec_help1.clear();
    }


    for(int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++){
            mtrx[i][j] -= vec1[i];
        }
    }

    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            if (mtrx[i][j]==0) {vec_help.push_back(0); continue;}
            else{
                vec_help.push_back(mtrx[i][j]);
            }
        }
        vec_help.erase(std::remove_if(std::begin(vec_help),std::end(vec_help), [](const auto& value) {return std::isnan(value);}),std::end(vec_help));
        vec2.push_back(*std::min_element(vec_help.begin(),vec_help.end()));
        vec_help.clear();
    }


    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            mtrx[i][j] -= vec2[j];
        }
    }


    vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
    vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));


     for(std::vector<double>::iterator it = vec1.begin(); it!= vec1.end(); it++){
         lower_bound += *it;
     }
     for(std::vector<double>::iterator it = vec2.begin(); it!= vec2.end(); it++){
        lower_bound += *it;
     }
    return lower_bound + ss;
}